

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

double duckdb::TryCastCInternal<duckdb::hugeint_t,double,duckdb::TryCast>
                 (duckdb_result *result,idx_t col,idx_t row)

{
  void *pvVar1;
  bool bVar2;
  double in_RAX;
  bool in_R8B;
  double dVar3;
  hugeint_t input;
  double result_value;
  double local_8;
  
  pvVar1 = result->deprecated_columns[col].deprecated_data;
  input.upper = (int64_t)&local_8;
  input.lower = *(uint64_t *)((long)pvVar1 + row * 0x10 + 8);
  local_8 = in_RAX;
  bVar2 = TryCast::Operation<duckdb::hugeint_t,double>
                    (*(TryCast **)((long)pvVar1 + row * 0x10),input,(double *)0x0,in_R8B);
  dVar3 = 0.0;
  if (bVar2) {
    dVar3 = local_8;
  }
  return dVar3;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}